

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxUniformComponentsTest::getShaderParts
          (GeometryShaderMaxUniformComponentsTest *this,GLchar ***out_fragment_shader_parts,
          uint *out_n_fragment_shader_parts,GLchar ***out_geometry_shader_parts,
          uint *out_n_geometry_shader_parts,GLchar ***out_vertex_shader_parts,
          uint *out_n_vertex_shader_parts)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  string local_1d8 [32];
  stringstream stream;
  undefined1 local_1a8 [376];
  
  iVar1 = (*((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  *out_fragment_shader_parts = &m_fragment_shader_code;
  *out_n_fragment_shader_parts = 1;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))
            ((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.
             m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,&this->m_max_uniform_components);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT pname.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x52a);
  this->m_max_uniform_vectors = this->m_max_uniform_components / 4;
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ostream::operator<<(local_1a8,this->m_max_uniform_vectors);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_max_uniform_vectors_string,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  this->m_geometry_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(points)                 in;\nlayout(points, max_vertices=1) out;\n\n// definition of NUMBER_OF_UNIFORMS goes here\n"
  ;
  this->m_geometry_shader_parts[1] = "#define NUMBER_OF_UNIFORMS ";
  this->m_geometry_shader_parts[2] = (this->m_max_uniform_vectors_string)._M_dataplus._M_p;
  this->m_geometry_shader_parts[3] =
       "u\n\nuniform ivec4 uni_array[NUMBER_OF_UNIFORMS];\n\nflat out uint gs_out_sum;\n\nvoid main()\n{\n    gs_out_sum = 0u;\n\n    for (uint i = 0u; i < NUMBER_OF_UNIFORMS; ++i)\n    {\n        gs_out_sum += uint(uni_array[i].x);\n        gs_out_sum += uint(uni_array[i].y);\n        gs_out_sum += uint(uni_array[i].z);\n        gs_out_sum += uint(uni_array[i].w);\n    }\n    EmitVertex();\n    \n    EndPrimitive();\n}\n"
  ;
  *out_geometry_shader_parts = this->m_geometry_shader_parts;
  *out_n_geometry_shader_parts = 4;
  *out_vertex_shader_parts = &m_vertex_shader_code;
  *out_n_vertex_shader_parts = 1;
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void GeometryShaderMaxUniformComponentsTest::getShaderParts(const glw::GLchar* const*& out_fragment_shader_parts,
															unsigned int&			   out_n_fragment_shader_parts,
															const glw::GLchar* const*& out_geometry_shader_parts,
															unsigned int&			   out_n_geometry_shader_parts,
															const glw::GLchar* const*& out_vertex_shader_parts,
															unsigned int&			   out_n_vertex_shader_parts)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fragment Shader */
	out_fragment_shader_parts   = &m_fragment_shader_code;
	out_n_fragment_shader_parts = 1;

	/* Get maximum number of uniform */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &m_max_uniform_components);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT pname.");

	m_max_uniform_vectors = m_max_uniform_components / 4 /* 4 components per vector */;

	std::stringstream stream;
	stream << m_max_uniform_vectors;
	m_max_uniform_vectors_string = stream.str();

	/* Geometry Shader */
	m_geometry_shader_parts[0] = m_geometry_shader_code_preamble;
	m_geometry_shader_parts[1] = m_geometry_shader_code_number_of_uniforms;
	m_geometry_shader_parts[2] = m_max_uniform_vectors_string.c_str();
	m_geometry_shader_parts[3] = m_geometry_shader_code_body;

	out_geometry_shader_parts   = m_geometry_shader_parts;
	out_n_geometry_shader_parts = 4;

	/* Vertex Shader */
	out_vertex_shader_parts   = &m_vertex_shader_code;
	out_n_vertex_shader_parts = 1;
}